

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationWindingTests.cpp
# Opt level: O1

void __thiscall
vkt::tessellation::anon_unknown_7::WindingTest::WindingTest
          (WindingTest *this,TestContext *testCtx,TessPrimitiveType primitiveType,Winding winding,
          bool yFlip)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  long *local_1c8 [2];
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    pcVar3 = "triangles";
  }
  else if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
    pcVar3 = "isolines";
  }
  else {
    if (primitiveType != TESSPRIMITIVETYPE_QUADS) {
      bVar1 = true;
      pcVar3 = (char *)0x0;
      goto LAB_00770c70;
    }
    pcVar3 = "quads";
  }
  bVar1 = false;
LAB_00770c70:
  if (bVar1) {
    std::ios::clear((int)local_1c8 + (int)*(undefined8 *)((long)local_1a8[0] + -0x18) + 0x20);
  }
  else {
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
  pcVar3 = (char *)0x0;
  if (winding == WINDING_CW) {
    pcVar3 = "cw";
  }
  __s = "ccw";
  if (winding != WINDING_CCW) {
    __s = pcVar3;
  }
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_1c8 + (int)*(undefined8 *)((long)local_1a8[0] + -0x18) + 0x20);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
  }
  if (yFlip) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_yflip",6);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
  tcu::TestCase::TestCase((TestCase *)this,testCtx,(char *)local_1c8[0],(char *)local_1a8[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d1aed0;
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d2e900;
  this->m_primitiveType = primitiveType;
  this->m_winding = winding;
  this->m_yFlip = yFlip;
  return;
}

Assistant:

WindingTest::WindingTest (tcu::TestContext&			testCtx,
						  const TessPrimitiveType	primitiveType,
						  const Winding				winding,
						  bool						yFlip)
	: TestCase			(testCtx, getCaseName(primitiveType, winding, yFlip), "")
	, m_primitiveType	(primitiveType)
	, m_winding			(winding)
	, m_yFlip			(yFlip)
{
}